

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O1

string * anon_unknown.dwarf_1900a8::generateNamespacedType
                   (string *__return_storage_ptr__,string *type)

{
  pointer pcVar1;
  undefined8 uVar2;
  bool bVar3;
  int iVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  pointer local_38;
  long local_30 [2];
  
  local_60._M_string_length = (size_type)(type->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)type->_M_string_length;
  bVar3 = std::basic_string_view<char,_std::char_traits<char>_>::starts_with
                    ((basic_string_view<char,_std::char_traits<char>_> *)&local_60,"Vk");
  if (bVar3) {
    local_40 = local_30;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Vk","");
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    pcVar1 = (type->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_60,pcVar1,pcVar1 + type->_M_string_length);
    if ((local_38 <= local_60._M_string_length) &&
       ((local_38 == (pointer)0x0 ||
        (iVar4 = bcmp(local_60._M_dataplus._M_p,local_40,(size_t)local_38), iVar4 == 0)))) {
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                (&local_60,0,(size_type)local_38);
    }
    pbVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
             replace(&local_60,0,0,"VULKAN_HPP_NAMESPACE::",0x16);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (pbVar5->_M_dataplus)._M_p;
    paVar6 = &pbVar5->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar1 == paVar6) {
      uVar2 = *(undefined8 *)((long)&pbVar5->field_2 + 8);
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uVar2;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = pcVar1;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_string_length = pbVar5->_M_string_length;
    (pbVar5->_M_dataplus)._M_p = (pointer)paVar6;
    pbVar5->_M_string_length = 0;
    (pbVar5->field_2)._M_local_buf[0] = '\0';
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar1 = (type->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,pcVar1,pcVar1 + type->_M_string_length);
  }
  if (bVar3) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_40 != local_30) {
      operator_delete(local_40,local_30[0] + 1);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string generateNamespacedType( std::string const & type )
  {
    return type.starts_with( "Vk" ) ? ( "VULKAN_HPP_NAMESPACE::" + stripPrefix( type, "Vk" ) ) : type;
  }